

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitallocator.cpp
# Opt level: O2

void __thiscall
asmjit::v1_14::JitAllocatorBlock::markShrunkArea
          (JitAllocatorBlock *this,uint32_t shrunkAreaStart,uint32_t shrunkAreaEnd)

{
  ulong *puVar1;
  long *plVar2;
  BitWord *pBVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  
  if (shrunkAreaStart == 0) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/jitallocator.cpp"
               ,0x179,"shrunkAreaStart != 0");
  }
  uVar7 = shrunkAreaEnd - shrunkAreaStart;
  if (uVar7 != 0) {
    plVar2 = (long *)((long)this->_pool->totalAreaUsed + (ulong)(this->_flags & 8));
    *plVar2 = *plVar2 - (ulong)uVar7;
    this->_areaUsed = this->_areaUsed - uVar7;
    uVar5 = this->_searchStart;
    if (shrunkAreaStart <= this->_searchStart) {
      uVar5 = shrunkAreaStart;
    }
    uVar6 = this->_searchEnd;
    if (this->_searchEnd <= shrunkAreaEnd) {
      uVar6 = shrunkAreaEnd;
    }
    this->_searchStart = uVar5;
    this->_searchEnd = uVar6;
    Support::Internal::
    bitVectorOp<unsigned_long,asmjit::v1_14::Support::AndNot,asmjit::v1_14::Support::SetNot>
              (this->_usedBitVector,(ulong)shrunkAreaStart,(ulong)uVar7);
    pBVar3 = this->_stopBitVector;
    bVar4 = (byte)(shrunkAreaEnd - 1) & 0x3f;
    puVar1 = pBVar3 + (shrunkAreaEnd - 1 >> 6);
    *puVar1 = *puVar1 & (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
    puVar1 = pBVar3 + (shrunkAreaStart - 1 >> 6);
    *puVar1 = *puVar1 | 1L << ((byte)(shrunkAreaStart - 1) & 0x3f);
    *(byte *)&this->_flags = (byte)this->_flags | 4;
    return;
  }
  DebugUtils::assertionFailed
            ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/jitallocator.cpp"
             ,0x17a,"shrunkAreaSize != 0");
}

Assistant:

inline void markShrunkArea(uint32_t shrunkAreaStart, uint32_t shrunkAreaEnd) noexcept {
    uint32_t shrunkAreaSize = shrunkAreaEnd - shrunkAreaStart;

    // Shrunk area cannot start at zero as it would mean that we have shrunk the first
    // block to zero bytes, which is not allowed as such block must be released instead.
    ASMJIT_ASSERT(shrunkAreaStart != 0);
    ASMJIT_ASSERT(shrunkAreaSize != 0);

    // Update the search region and statistics.
    _pool->totalAreaUsed[size_t(hasLargePages())] -= shrunkAreaSize;
    _areaUsed -= shrunkAreaSize;
    _searchStart = Support::min(_searchStart, shrunkAreaStart);
    _searchEnd = Support::max(_searchEnd, shrunkAreaEnd);

    // Unmark the released space and move the sentinel.
    Support::bitVectorClear(_usedBitVector, shrunkAreaStart, shrunkAreaSize);
    Support::bitVectorSetBit(_stopBitVector, shrunkAreaEnd - 1, false);
    Support::bitVectorSetBit(_stopBitVector, shrunkAreaStart - 1, true);

    addFlags(kFlagDirty);
  }